

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

void CombinationKeygenRecurse<Blob<160>,block32>
               (block32 *key,int len,int maxlen,block32 *blocks,int blockcount,pfHash hash,
               vector<Blob<160>,_std::allocator<Blob<160>_>_> *hashes)

{
  undefined8 *puVar1;
  long in_RCX;
  undefined8 *puVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  code *in_R9;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> *unaff_retaddr;
  Blob<160> h;
  int i;
  undefined1 local_40 [8];
  value_type *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_ESI != in_EDX) {
    for (iVar3 = 0; iVar3 < in_R8D; iVar3 = iVar3 + 1) {
      puVar2 = (undefined8 *)(in_RCX + (long)iVar3 * 0x20);
      puVar1 = (undefined8 *)(in_RDI + (long)in_ESI * 0x20);
      *puVar1 = *puVar2;
      puVar1[1] = puVar2[1];
      puVar1[2] = puVar2[2];
      puVar1[3] = puVar2[3];
      Blob<160>::Blob((Blob<160> *)local_40);
      (*in_R9)(in_RDI,((long)(in_ESI + 1) & 0x7ffffffU) << 5,0,local_40);
      std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back
                ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)
                 CONCAT44(iVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
      CombinationKeygenRecurse<Blob<160>,block32>
                ((block32 *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
                 (block32 *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),(int)((ulong)in_R9 >> 0x20),
                 (pfHash)CONCAT44(iVar3,in_stack_ffffffffffffffd0),unaff_retaddr);
    }
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}